

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_line_ended(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  size_t sVar3;
  Location LVar4;
  bool bVar5;
  State *pSVar6;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  csubstr cVar11;
  char *pcStack_78;
  size_t local_70;
  char msg [74];
  
  pSVar6 = this->m_state;
  sVar8 = (pSVar6->line_contents).stripped.len;
  if ((pSVar6->pos).super_LineCol.col != sVar8 + 1) {
    pcVar9 = "check failed: (m_state->pos.col == m_state->line_contents.stripped.len+1)";
    pcVar10 = msg;
    for (lVar7 = 0x4a; lVar7 != 0; lVar7 = lVar7 + -1) {
      *pcVar10 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      pcVar10 = pcVar10 + 1;
    }
    if (((byte)s_error_flags & 1) != 0) {
      bVar5 = is_debugger_attached();
      if (bVar5) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar11 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_70 = cVar11.len;
    pcStack_78 = cVar11.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x76a6) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x76a6) << 0x40,8);
    LVar4.name.str = pcStack_78;
    LVar4.name.len = local_70;
    (*p_Var1)(msg,0x4a,LVar4,(this->m_stack).m_callbacks.m_user_data);
    pSVar6 = this->m_state;
    sVar8 = (pSVar6->line_contents).stripped.len;
  }
  sVar3 = (pSVar6->pos).super_LineCol.line;
  (pSVar6->pos).super_LineCol.offset =
       ((pSVar6->line_contents).full.len - sVar8) + (pSVar6->pos).super_LineCol.offset;
  (pSVar6->pos).super_LineCol.line = sVar3 + 1;
  (pSVar6->pos).super_LineCol.col = 1;
  return;
}

Assistant:

void Parser::_line_ended()
{
    _c4dbgpf("line[{}] ({} cols) ended! offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, m_state->pos.offset, m_state->pos.offset+m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == m_state->line_contents.stripped.len+1);
    m_state->pos.offset += m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    ++m_state->pos.line;
    m_state->pos.col = 1;
}